

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

int fxp_read_recv(sftp_packet *pktin,sftp_request *req,char *buffer,int len)

{
  ulong __n;
  ptrlen pVar1;
  
  safefree(req);
  if (pktin->type == 0x67) {
    pVar1 = BinarySource_get_string(pktin->binarysource_);
    __n = pVar1.len;
    if (pktin->binarysource_[0].err == BSE_NO_ERROR) {
      if (__n <= (ulong)(long)len) {
        memcpy(buffer,pVar1.ptr,__n);
        sftp_pkt_free(pktin);
        goto LAB_00113f2a;
      }
      fxp_error_message = "READ returned more bytes than requested";
    }
    else {
      fxp_error_message = "READ returned malformed SSH_FXP_DATA packet";
    }
    fxp_errtype = -1;
  }
  else {
    fxp_got_status(pktin);
  }
  sftp_pkt_free(pktin);
  __n = 0xffffffff;
LAB_00113f2a:
  return (int)__n;
}

Assistant:

int fxp_read_recv(struct sftp_packet *pktin, struct sftp_request *req,
                  char *buffer, int len)
{
    sfree(req);
    if (pktin->type == SSH_FXP_DATA) {
        ptrlen data;

        data = get_string(pktin);
        if (get_err(pktin)) {
            fxp_internal_error("READ returned malformed SSH_FXP_DATA packet");
            sftp_pkt_free(pktin);
            return -1;
        }

        if (data.len > len) {
            fxp_internal_error("READ returned more bytes than requested");
            sftp_pkt_free(pktin);
            return -1;
        }

        memcpy(buffer, data.ptr, data.len);
        sftp_pkt_free(pktin);
        return data.len;
    } else {
        fxp_got_status(pktin);
        sftp_pkt_free(pktin);
        return -1;
    }
}